

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void DC16NoLeft_SSE2(uint8_t *dst)

{
  undefined1 auVar1 [16];
  
  auVar1 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(dst + -0x20));
  Put16_SSE2((uint8_t)((ushort)(auVar1._8_2_ + auVar1._0_2_) + 8 >> 4),dst);
  return;
}

Assistant:

static void DC16NoLeft_SSE2(uint8_t* dst) {  // DC with left samples unavailable
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadu_si128((const __m128i*)(dst - BPS));
  const __m128i sad8x2 = _mm_sad_epu8(top, zero);
  // sum the two sads: sad8x2[0:1] + sad8x2[8:9]
  const __m128i sum = _mm_add_epi16(sad8x2, _mm_shuffle_epi32(sad8x2, 2));
  const int DC = _mm_cvtsi128_si32(sum) + 8;
  Put16_SSE2(DC >> 4, dst);
}